

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
 __thiscall ninx::parser::Parser::parse_function_argument(Parser *this)

{
  Token *token;
  int iVar1;
  ParserException *this_00;
  string *__args_1;
  string *in_RSI;
  Variable *local_c8;
  Variable *argument_token;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_60;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  default_value;
  allocator local_41;
  string local_40;
  Token *local_20;
  Token *raw_token;
  Parser *this_local;
  __single_object *argument;
  
  this_local = this;
  local_20 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
  iVar1 = (*local_20->_vptr_Token[2])();
  if (iVar1 == 3) {
    std::
    unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
    ::unique_ptr<std::default_delete<ninx::parser::element::Expression>,void>
              ((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
                *)&local_60,(nullptr_t)0x0);
    iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'=');
    if (iVar1 != 0) {
      TokenReader::get_token((TokenReader *)(in_RSI + 1));
      parse_expression((Parser *)&argument_token);
      std::
      unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ::operator=(&local_60,
                  (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                   *)&argument_token);
      std::
      unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                     *)&argument_token);
    }
    if (local_20 == (Token *)0x0) {
      local_c8 = (Variable *)0x0;
    }
    else {
      local_c8 = (Variable *)
                 __dynamic_cast(local_20,&lexer::token::Token::typeinfo,
                                &lexer::token::Variable::typeinfo,0);
    }
    __args_1 = lexer::token::Variable::get_name_abi_cxx11_(local_c8);
    std::
    make_unique<ninx::parser::element::FunctionArgument,std::__cxx11::string_const&,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>>
              (&this->origin,
               (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)__args_1);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr(&local_60);
    return (__uniq_ptr_data<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>,_true,_true>
              )this;
  }
  default_value._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._3_1_ = 1;
  this_00 = (ParserException *)__cxa_allocate_exception(0x20);
  token = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,
             "Argument expected but not found. Maybe you forgot to prepend $ to the argument name?",
             &local_41);
  exception::ParserException::ParserException(this_00,token,in_RSI,&local_40);
  default_value._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._3_1_ = 0;
  __cxa_throw(this_00,&exception::ParserException::typeinfo,
              exception::ParserException::~ParserException);
}

Assistant:

std::unique_ptr<FunctionArgument> ninx::parser::Parser::parse_function_argument() {
    auto raw_token{reader.get_token()};

    if (raw_token->get_type() != Type::VARIABLE) {
        throw ParserException(raw_token, this->origin, "Argument expected but not found. Maybe "
                                                       "you forgot to prepend $ to the argument"
                                                       " name?");
    }

    std::unique_ptr<Expression> default_value{nullptr};

    // Check if the argument does have a default value
    if (reader.check_limiter('=')) {
        reader.get_token();

        default_value = parse_expression();
    }

    auto argument_token{dynamic_cast<ninx::lexer::token::Variable *>(raw_token)};

    auto argument = std::make_unique<FunctionArgument>(argument_token->get_name(), std::move(default_value));

    return argument;
}